

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  slot_type sVar5;
  undefined1 auVar6 [16];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined8 uVar22;
  ctrl_t *pcVar23;
  size_t sVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  size_t i;
  byte bVar28;
  FindInfo FVar29;
  
  uVar25 = this->capacity_;
  if ((uVar25 == 0) || ((uVar25 + 1 & uVar25) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>]"
                 );
  }
  if (uVar25 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>]"
                 );
  }
  pcVar3 = this->ctrl_;
  if (pcVar3[uVar25] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar23 = pcVar3 + uVar25;
  if (pcVar23 + 1 != pcVar3) {
    uVar27 = 0;
    do {
      pcVar1 = pcVar3 + uVar27;
      cVar7 = pcVar1[1];
      cVar8 = pcVar1[2];
      cVar9 = pcVar1[3];
      cVar10 = pcVar1[4];
      cVar11 = pcVar1[5];
      cVar12 = pcVar1[6];
      cVar13 = pcVar1[7];
      cVar14 = pcVar1[8];
      cVar15 = pcVar1[9];
      cVar16 = pcVar1[10];
      cVar17 = pcVar1[0xb];
      cVar18 = pcVar1[0xc];
      cVar19 = pcVar1[0xd];
      cVar20 = pcVar1[0xe];
      cVar21 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar3 + uVar27);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      uVar27 = uVar27 + 0x10;
    } while (uVar25 + 1 != uVar27);
  }
  uVar22 = *(undefined8 *)(pcVar3 + 8);
  *(undefined8 *)(pcVar23 + 1) = *(undefined8 *)pcVar3;
  *(undefined8 *)(pcVar23 + 9) = uVar22;
  *pcVar23 = -1;
  sVar24 = this->capacity_;
  i = 0;
  if (sVar24 != 0) {
    do {
      if (*(char *)((long)&((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                             *)this->ctrl_)->ctrl_ + i) == -2) {
        uVar25 = (long)this->slots_[i].key * -0x395b586ca42e166b;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (uVar25 >> 0x2f ^ uVar25) * 0x35a98f4d286a90b9 + 0xe6546b64;
        uVar27 = SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar29 = find_first_non_full((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                                      *)this->ctrl_,sVar24);
        sVar24 = FVar29.offset;
        uVar25 = this->capacity_;
        if ((uVar25 + 1 & uVar25) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar26 = uVar27 >> 7 & uVar25;
        bVar28 = (byte)uVar27;
        if (((i - uVar26 ^ sVar24 - uVar26) & uVar25) < 0x10) {
          bVar28 = bVar28 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar24] == -2) {
            set_ctrl(this,sVar24,bVar28 & 0x7f);
            psVar4 = this->slots_;
            sVar5 = psVar4[i];
            psVar4[i] = psVar4[sVar24];
            this->slots_[sVar24] = sVar5;
            i = i - 1;
            goto LAB_00123948;
          }
          if (this->ctrl_[sVar24] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>]"
                         );
          }
          set_ctrl(this,sVar24,bVar28 & 0x7f);
          this->slots_[sVar24] = this->slots_[i];
          bVar28 = 0x80;
        }
        set_ctrl(this,i,bVar28);
      }
LAB_00123948:
      i = i + 1;
      sVar24 = this->capacity_;
    } while (i != sVar24);
  }
  reset_growth_left(this,i);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }